

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O3

BitMatrix *
ZXing::Deflate(BitMatrix *__return_storage_ptr__,BitMatrix *input,int width,int height,float top,
              float left,float subSampling)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
  iVar5 = __return_storage_ptr__->_height;
  if (0 < iVar5) {
    iVar3 = __return_storage_ptr__->_width;
    iVar7 = 0;
    do {
      if (0 < iVar3) {
        lVar6 = 0;
        do {
          bVar2 = BitMatrix::get(input,(int)((float)(int)lVar6 * subSampling + left),
                                 (int)((float)iVar7 * subSampling + top));
          if (bVar2) {
            lVar4 = (long)(__return_storage_ptr__->_width * iVar7);
            puVar1 = (__return_storage_ptr__->_bits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <=
                (ulong)(lVar6 + lVar4)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            puVar1[lVar6 + lVar4] = 0xff;
          }
          iVar3 = __return_storage_ptr__->_width;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < iVar3);
        iVar5 = __return_storage_ptr__->_height;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix Deflate(const BitMatrix& input, int width, int height, float top, float left, float subSampling)
{
	BitMatrix result(width, height);

	for (int y = 0; y < result.height(); y++) {
		auto yOffset = top + y * subSampling;
		for (int x = 0; x < result.width(); x++) {
			if (input.get(PointF(left + x * subSampling, yOffset)))
				result.set(x, y);
		}
	}

	return result;
}